

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::IFF_PDU::SetLayers
          (IFF_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
          *L)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  pointer pKVar4;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ::operator=(&this->m_vLayers,L);
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  pKVar2 = (L->
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (L->
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    KVar3 = DATA_TYPE::LayerHeader::GetLayerLength(pKVar4->m_pRef);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar3;
  }
  return;
}

Assistant:

void IFF_PDU::SetLayers( const vector<LyrHdrPtr> & L )
{
	m_vLayers = L;
	m_ui16PDULength = IFF_PDU_SIZE;
	vector<LyrHdrPtr>::const_iterator citr = L.begin();
	vector<LyrHdrPtr>::const_iterator citrEnd = L.end();
	for( ; citr != citrEnd; ++citr )
	{
		m_ui16PDULength += ( *citr )->GetLayerLength();
	}
}